

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

float * stbi_loadf_from_memory(stbi_uc *buffer,int len,int *x,int *y,int *comp,int req_comp)

{
  long lVar1;
  float *pfVar2;
  stbi_uc *data;
  byte *pbVar3;
  char cVar4;
  uint uVar5;
  stbi sStack_48;
  
  sStack_48.img_buffer_end = buffer + len;
  cVar4 = '#';
  lVar1 = 1;
  pbVar3 = buffer;
  while( true ) {
    uVar5 = 0;
    if (pbVar3 < sStack_48.img_buffer_end) {
      uVar5 = (uint)*pbVar3;
      pbVar3 = pbVar3 + 1;
    }
    if (uVar5 != (int)cVar4) break;
    cVar4 = "#?RADIANCE\n"[lVar1];
    lVar1 = lVar1 + 1;
    if (lVar1 == 0xc) {
      sStack_48.img_file = (FILE *)0x0;
      sStack_48.img_buffer = buffer;
      pfVar2 = hdr_load(&sStack_48,x,y,comp,req_comp);
      return pfVar2;
    }
  }
  data = stbi_load_from_memory(buffer,len,x,y,comp,req_comp);
  if (data == (stbi_uc *)0x0) {
    failure_reason = "Image not of any known type, or corrupt";
    return (float *)0x0;
  }
  if (req_comp == 0) {
    req_comp = *comp;
  }
  pfVar2 = ldr_to_hdr(data,*x,*y,req_comp);
  return pfVar2;
}

Assistant:

float *stbi_loadf_from_memory(stbi_uc const *buffer, int len, int *x, int *y, int *comp, int req_comp)
{
   stbi_uc *data;
   #ifndef STBI_NO_HDR
   if (stbi_hdr_test_memory(buffer, len))
      return stbi_hdr_load_from_memory(buffer, len,x,y,comp,req_comp);
   #endif
   data = stbi_load_from_memory(buffer, len, x, y, comp, req_comp);
   if (data)
      return ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return epf("unknown image type", "Image not of any known type, or corrupt");
}